

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::ClassId
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_68;
  TPZGeoTetrahedra local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"TPZMultiphysicsCompEl","");
  uVar1 = Hash(&local_68);
  iVar2 = TPZCompEl::ClassId((TPZCompEl *)this);
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[0]._0_4_ = 0xffffffff;
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[0]._4_4_ = 0xffffffff;
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[1]._0_4_ = 0xffffffff;
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[1]._4_4_ = 0xffffffff;
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[2]._0_4_ = 0xffffffff;
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[2]._4_4_ = 0xffffffff;
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[3]._0_4_ = 0xffffffff;
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes[3]._4_4_ = 0xffffffff;
  local_48.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.super_TPZSavable.
  _vptr_TPZSavable = (TPZSavable)&PTR__TPZGeoTetrahedra_018b5510;
  iVar3 = pzgeom::TPZGeoTetrahedra::ClassId(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::ClassId() const{
    return Hash("TPZMultiphysicsCompEl") ^ TPZMultiphysicsElement::ClassId() << 1 ^ TGeometry().ClassId() << 2;
}